

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hpp
# Opt level: O0

void pretty_print::
     print_container_helper<std::vector<int,_std::allocator<int>_>,_char,_std::char_traits<char>,_pretty_print::delimiters<std::vector<int,_std::allocator<int>_>,_char>_>
     ::printer<std::vector<int,_std::allocator<int>_>_>::print_body
               (vector<int,_std::allocator<int>_> *c,ostream_type *stream)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator the_end;
  const_iterator it;
  ostream_type *stream_local;
  vector<int,_std::allocator<int>_> *c_local;
  
  the_end = std::begin<std::vector<int,std::allocator<int>>>(c);
  local_28._M_current = (int *)std::end<std::vector<int,std::allocator<int>>>(c);
  bVar1 = __gnu_cxx::operator!=(&the_end,&local_28);
  if (bVar1) {
    while( true ) {
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&the_end);
      std::ostream::operator<<(stream,*piVar2);
      __lhs = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&the_end);
      bVar1 = __gnu_cxx::operator==(__lhs,&local_28);
      if (bVar1) break;
      std::operator<<(stream,", ");
    }
  }
  return;
}

Assistant:

static void print_body(const U & c, ostream_type & stream)
            {
                using std::begin;
                using std::end;

                auto it = begin(c);
                const auto the_end = end(c);

                if (it != the_end)
                {
                    for ( ; ; )
                    {
                        stream << *it;

                    if (++it == the_end) break;

                    if (delimiters_type::values.delimiter != NULL)
                        stream << delimiters_type::values.delimiter;
                    }
                }
            }